

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Track::AddContentEncoding(Track *this)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  ContentEncoding **ppCVar4;
  ContentEncoding *this_00;
  ContentEncoding *local_60;
  uint local_50;
  uint32_t i;
  ContentEncoding *content_encoding;
  ContentEncoding **content_encoding_entries;
  uint32_t count;
  Track *this_local;
  
  uVar2 = this->content_encoding_entries_size_ + 1;
  auVar1 = ZEXT416(uVar2) * ZEXT816(8);
  uVar3 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppCVar4 = (ContentEncoding **)operator_new__(uVar3,(nothrow_t *)&std::nothrow);
  if (ppCVar4 == (ContentEncoding **)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = (ContentEncoding *)operator_new(0x38,(nothrow_t *)&std::nothrow);
    local_60 = (ContentEncoding *)0x0;
    if (this_00 != (ContentEncoding *)0x0) {
      ContentEncoding::ContentEncoding(this_00);
      local_60 = this_00;
    }
    if (local_60 == (ContentEncoding *)0x0) {
      if (ppCVar4 != (ContentEncoding **)0x0) {
        operator_delete__(ppCVar4);
      }
      this_local._7_1_ = false;
    }
    else {
      for (local_50 = 0; local_50 < this->content_encoding_entries_size_; local_50 = local_50 + 1) {
        ppCVar4[local_50] = this->content_encoding_entries_[local_50];
      }
      if (this->content_encoding_entries_ != (ContentEncoding **)0x0) {
        operator_delete__(this->content_encoding_entries_);
      }
      this->content_encoding_entries_ = ppCVar4;
      this->content_encoding_entries_[this->content_encoding_entries_size_] = local_60;
      this->content_encoding_entries_size_ = uVar2;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Track::AddContentEncoding() {
  const uint32_t count = content_encoding_entries_size_ + 1;

  ContentEncoding** const content_encoding_entries =
      new (std::nothrow) ContentEncoding*[count];  // NOLINT
  if (!content_encoding_entries)
    return false;

  ContentEncoding* const content_encoding =
      new (std::nothrow) ContentEncoding();  // NOLINT
  if (!content_encoding) {
    delete[] content_encoding_entries;
    return false;
  }

  for (uint32_t i = 0; i < content_encoding_entries_size_; ++i) {
    content_encoding_entries[i] = content_encoding_entries_[i];
  }

  delete[] content_encoding_entries_;

  content_encoding_entries_ = content_encoding_entries;
  content_encoding_entries_[content_encoding_entries_size_] = content_encoding;
  content_encoding_entries_size_ = count;
  return true;
}